

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall
Arithmetic_FoldBinary_Test::Arithmetic_FoldBinary_Test(Arithmetic_FoldBinary_Test *this)

{
  Arithmetic_FoldBinary_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Arithmetic_FoldBinary_Test_00243d88;
  return;
}

Assistant:

TEST(Arithmetic, FoldBinary) {
	MockParser mock(
		"let a = 3 + 4\n"
		"let b = 3 + 4 * 5\n"
		"let c = (3 + 10) * 2\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_N, 1, 1);
	INS2(BC_SET_N, 2, 2);
	INS(BC_RET, 0, 0, 0);
}